

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_pax_global(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  size_t *in_RCX;
  void *in_RDX;
  archive_string *in_RSI;
  tar *in_RDI;
  wchar_t err;
  size_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  wVar1 = read_body_to_string((archive_read *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI,in_RDX,in_RCX);
  if (wVar1 == L'\0') {
    wVar1 = tar_read_header((archive_read *)entry,(tar *)h,(archive_entry *)unconsumed,unaff_retaddr
                           );
  }
  return wVar1;
}

Assistant:

static int
header_pax_global(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	err = read_body_to_string(a, tar, &(tar->pax_global), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);
	err = tar_read_header(a, tar, entry, unconsumed);
	return (err);
}